

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_21a7::DataTransform<sptk::int24_t,_sptk::int24_t>::~DataTransform
          (DataTransform<sptk::int24_t,_sptk::int24_t> *this)

{
  pointer pcVar1;
  
  (this->super_DataTransformInterface)._vptr_DataTransformInterface =
       (_func_int **)&PTR__DataTransform_001619b8;
  pcVar1 = (this->print_format_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->print_format_).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

~DataTransform() override {
  }